

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  bool bVar3;
  pointer lhs;
  pointer rhs;
  vector<Point,_std::allocator<Point>_> original_points;
  vector<Point,_std::allocator<Point>_> processed_points;
  string local_68;
  vector<Point,_std::allocator<Point>_> local_48;
  vector<Point,_std::allocator<Point>_> local_30;
  
  lVar2 = *(long *)(std::cin + -0x18);
  *(uint *)(&DAT_00107184 + lVar2) = *(uint *)(&DAT_00107184 + lVar2) | 1;
  std::ios::clear((int)lVar2 + 0x107168);
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Enter 7 points. To terminate the input enter semicolon (;).","");
  prompt_for_input(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Example: (2 5) (3 5);","");
  prompt_for_input(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  get_points(&local_48,(istream *)&std::cin);
  print_points(&local_48);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"mydata.txt","");
  write_points_to_file(&local_68,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"mydata.txt","");
  read_points_from_file(&local_30,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  print_points(&local_30);
  lhs = local_48.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_start;
  rhs = local_30.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_start;
  if ((long)local_48.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_48.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_30.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_30.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start) {
    for (; lhs != local_48.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                  super__Vector_impl_data._M_finish; lhs = lhs + 1) {
      bVar3 = operator==(lhs,rhs);
      if (!bVar3) goto LAB_00102d3f;
      rhs = rhs + 1;
    }
  }
  else {
LAB_00102d3f:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Something\'s wrong!\n",0x13);
  }
  if (local_30.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_start != (Point *)0x0) {
    operator_delete(local_30.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_start != (Point *)0x0) {
    operator_delete(local_48.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
	std::cin.exceptions(std::cin.exceptions() | std::ios_base::badbit);
	prompt_for_input("Enter 7 points. To terminate the input enter semicolon (;).");
	prompt_for_input("Example: (2 5) (3 5);");
	try
	{
		std::vector<Point> original_points = get_points(std::cin);
		print_points(original_points);
		write_points_to_file("mydata.txt", original_points);
		auto processed_points = read_points_from_file("mydata.txt");
		print_points(processed_points);
		if (!are_set_equals(original_points, processed_points))
		{
			std::cerr << "Something's wrong!\n";
		}
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}
	
}